

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

NSVGimage * nsvgParse(char *input,char *units,float dpi)

{
  NSVGparser *p_00;
  NSVGimage *ret;
  NSVGparser *p;
  float dpi_local;
  char *units_local;
  char *input_local;
  
  p_00 = nsvg__createParser();
  if (p_00 == (NSVGparser *)0x0) {
    input_local = (char *)0x0;
  }
  else {
    p_00->dpi = dpi;
    nsvg__parseXML(input,nsvg__startElement,nsvg__endElement,nsvg__content,p_00);
    nsvg__scaleToViewbox(p_00,units);
    input_local = (char *)p_00->image;
    p_00->image = (NSVGimage *)0x0;
    nsvg__deleteParser(p_00);
  }
  return (NSVGimage *)input_local;
}

Assistant:

NSVGimage* nsvgParse(char* input, const char* units, float dpi)
{
	NSVGparser* p;
	NSVGimage* ret = 0;

	p = nsvg__createParser();
	if (p == NULL) {
		return NULL;
	}
	p->dpi = dpi;

	nsvg__parseXML(input, nsvg__startElement, nsvg__endElement, nsvg__content, p);

	// Scale to viewBox
	nsvg__scaleToViewbox(p, units);

	ret = p->image;
	p->image = NULL;

	nsvg__deleteParser(p);

	return ret;
}